

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeFloatingState.cpp
# Opt level: O2

void __thiscall iDynTree::FreeFloatingVel::FreeFloatingVel(FreeFloatingVel *this)

{
  this->_vptr_FreeFloatingVel = (_func_int **)&PTR__FreeFloatingVel_001e6108;
  iDynTree::Twist::Twist(&this->m_baseVel);
  JointDOFsDoubleArray::JointDOFsDoubleArray(&this->m_jointVel,0);
  SpatialVector<iDynTree::SpatialMotionVector>::zero
            ((SpatialVector<iDynTree::SpatialMotionVector> *)&this->m_baseVel);
  JointDOFsDoubleArray::resize(&this->m_jointVel,0);
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

FreeFloatingVel::FreeFloatingVel()
{
    this->m_baseVel.zero();
    this->m_jointVel.resize(0);
    this->m_jointVel.zero();
}